

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O1

void __thiscall dynamicgraph::TracerRealTime::trace(TracerRealTime *this)

{
  long *plVar1;
  long lVar2;
  ExceptionTraces *pEVar3;
  _List_node_base *p_Var4;
  long *plVar5;
  ErrorCodeEnum local_54;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  plVar5 = *(long **)&this->field_0x190;
  if ((long *)&this->field_0x190 != plVar5) {
    p_Var4 = (_List_node_base *)&this->hardFiles;
    do {
      if (plVar5[2] == 0) {
        pEVar3 = (ExceptionTraces *)__cxa_allocate_exception(0x30);
        local_54 = NOT_OPEN;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"The buffer is null","");
        dynamicgraph::ExceptionTraces::ExceptionTraces(pEVar3,&local_54,(string *)local_50,"");
        __cxa_throw(pEVar3,&ExceptionTraces::typeinfo,ExceptionAbstract::~ExceptionAbstract);
      }
      p_Var4 = (((_List_base<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      lVar2 = __dynamic_cast(plVar5[2],&std::ostream::typeinfo,&OutStringStream::typeinfo,0);
      if (lVar2 == 0) {
        pEVar3 = (ExceptionTraces *)__cxa_allocate_exception(0x30);
        local_54 = NOT_OPEN;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"The buffer is not open","");
        dynamicgraph::ExceptionTraces::ExceptionTraces(pEVar3,&local_54,(string *)local_50,"");
        __cxa_throw(pEVar3,&ExceptionTraces::typeinfo,ExceptionAbstract::~ExceptionAbstract);
      }
      plVar1 = (long *)p_Var4[1]._M_next;
      if (*(int *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) != 0) {
        pEVar3 = (ExceptionTraces *)__cxa_allocate_exception(0x30);
        local_54 = NOT_OPEN;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"The file is not open","");
        dynamicgraph::ExceptionTraces::ExceptionTraces(pEVar3,&local_54,(string *)local_50,"");
        __cxa_throw(pEVar3,&ExceptionTraces::typeinfo,ExceptionAbstract::~ExceptionAbstract);
      }
      std::ostream::write((char *)plVar1,*(long *)(lVar2 + 0x70));
      *(undefined8 *)(lVar2 + 0x78) = 0;
      *(undefined1 *)(lVar2 + 0x88) = 0;
      std::ostream::flush();
      plVar5 = (long *)*plVar5;
    } while ((long *)&this->field_0x190 != plVar5);
  }
  return;
}

Assistant:

void TracerRealTime::trace() {
  dgDEBUGIN(15);

  FileList::iterator iter = files.begin();
  HardFileList::iterator hardIter = hardFiles.begin();

  while (files.end() != iter) {
    dgDEBUG(35) << "Next" << endl;
    std::ostream *os = *iter;
    if (NULL == os) {
      DG_THROW ExceptionTraces(ExceptionTraces::NOT_OPEN, "The buffer is null",
                               "");
    }
    // std::stringstream & file = * dynamic_cast< stringstream* >(os);
    OutStringStream *file = dynamic_cast<OutStringStream *>(os);  // segfault
    if (NULL == file) {
      DG_THROW ExceptionTraces(ExceptionTraces::NOT_OPEN,
                               "The buffer is not open", "");
    }

    std::ofstream &hardFile = **hardIter;
    if (!hardFile.good()) {
      DG_THROW ExceptionTraces(ExceptionTraces::NOT_OPEN,
                               "The file is not open", "");
    }

    if ((hardFile.good()) && (NULL != file)) {
      file->dump(hardFile);
      file->empty();
      hardFile.flush();
    }

    ++iter;
    ++hardIter;
  }

  dgDEBUGOUT(15);
}